

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O2

int enet_protocol_send_outgoing_commands(ENetHost *host,ENetEvent *event,int checkForTimeouts)

{
  byte *pbVar1;
  ENetList *pEVar2;
  ENetList *pEVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ushort uVar6;
  enet_uint32 eVar7;
  uint uVar8;
  enet_uint32 eVar9;
  _ENetListNode *p_Var10;
  _func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *p_Var11;
  ENetChecksumCallback p_Var12;
  size_t sVar13;
  ENetPacket *packet;
  ENetListIterator position;
  ushort uVar14;
  int iVar15;
  enet_uint32 eVar16;
  ENetPeer *pEVar17;
  size_t sVar18;
  void *pvVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  ENetPeer *peer;
  _ENetListNode *p_Var24;
  ENetListIterator position_00;
  ulong uVar25;
  enet_uint8 headerData [8];
  
  host->continueSending = 1;
  iVar15 = 1;
  do {
    if (iVar15 == 0) {
      return 0;
    }
    host->continueSending = 0;
    pEVar17 = host->peers;
    for (peer = pEVar17; peer < pEVar17 + host->peerCount; peer = peer + 1) {
      if ((peer->state != ENET_PEER_STATE_DISCONNECTED) && (peer->state != ENET_PEER_STATE_ZOMBIE))
      {
        host->headerFlags = 0;
        host->commandCount = 0;
        host->bufferCount = 1;
        host->packetSize = 4;
        p_Var24 = (peer->acknowledgements).sentinel.next;
        if (p_Var24 != &(peer->acknowledgements).sentinel) {
          lVar23 = 0x688;
          uVar25 = 0x6a;
          while (p_Var24 != &(peer->acknowledgements).sentinel) {
            if (0x669 < uVar25) {
              uVar25 = 0x66a;
              lVar23 = 0x888;
LAB_001594b5:
              host->continueSending = 1;
              break;
            }
            sVar18 = host->packetSize;
            if (peer->mtu - sVar18 < 8) goto LAB_001594b5;
            p_Var10 = p_Var24->next;
            *(ulong *)((long)host->commands + lVar23 + -0x6a) =
                 (long)host->commands + (uVar25 - 0x6a);
            *(undefined8 *)((long)host->commands + lVar23 + -0x62) = 8;
            host->packetSize = sVar18 + 8;
            uVar14 = *(ushort *)((long)&p_Var24[1].next + 6);
            uVar14 = uVar14 << 8 | uVar14 >> 8;
            *(undefined1 *)((long)host->commands + (uVar25 - 0x6a)) = 1;
            *(undefined1 *)((long)host->commands + (uVar25 - 0x69)) =
                 *(undefined1 *)((long)&p_Var24[1].next + 5);
            *(ushort *)((long)host->commands + (uVar25 - 0x68)) = uVar14;
            *(ushort *)((long)host->commands + (uVar25 - 0x66)) = uVar14;
            *(ushort *)((long)host->commands + (uVar25 - 100)) =
                 *(ushort *)&p_Var24[1].next << 8 | *(ushort *)&p_Var24[1].next >> 8;
            if (((ulong)p_Var24[1].next & 0xf00000000) == 0x400000000) {
              enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
            }
            enet_list_remove(p_Var24);
            enet_free(p_Var24);
            uVar25 = uVar25 + 0x30;
            lVar23 = lVar23 + 0x10;
            p_Var24 = p_Var10;
          }
          host->commandCount = (long)((short)((short)uVar25 + -0x6a) / 0x30);
          host->bufferCount = lVar23 + -0x678 >> 4;
        }
        if (checkForTimeouts != 0) {
          pEVar2 = &peer->sentReliableCommands;
          p_Var24 = (peer->sentReliableCommands).sentinel.next;
          if ((p_Var24 != &pEVar2->sentinel) && (host->serviceTime - peer->nextTimeout < 86400000))
          {
            position = (peer->outgoingCommands).sentinel.next;
            while (position_00 = p_Var24, position_00 != &pEVar2->sentinel) {
              p_Var24 = position_00->next;
              eVar16 = host->serviceTime;
              eVar7 = *(enet_uint32 *)((long)&position_00[1].next + 4);
              uVar22 = eVar16 - eVar7;
              uVar21 = eVar7 - eVar16;
              uVar20 = uVar22;
              if (86399999 < uVar22) {
                uVar20 = uVar21;
              }
              uVar8 = *(uint *)&position_00[1].previous;
              if (uVar8 <= uVar20) {
                eVar9 = peer->earliestTimeout;
                if ((eVar9 == 0) || (86399999 < eVar7 - eVar9)) {
                  peer->earliestTimeout = eVar7;
                  if (eVar7 != 0) goto LAB_0015987e;
                }
                else {
                  uVar22 = eVar16 - eVar9;
                  uVar21 = eVar9 - eVar16;
LAB_0015987e:
                  if (uVar22 < 86400000) {
                    uVar21 = uVar22;
                  }
                  if ((peer->timeoutMaximum <= uVar21) ||
                     ((*(uint *)((long)&position_00[1].previous + 4) <= uVar8 &&
                      (peer->timeoutMinimum <= uVar21)))) {
                    enet_protocol_notify_disconnect(host,peer,event);
                    if ((event != (ENetEvent *)0x0) && (event->type != ENET_EVENT_TYPE_NONE)) {
                      return 1;
                    }
                    goto LAB_00159800;
                  }
                }
                if (position_00[5].previous != (_ENetListNode *)0x0) {
                  peer->reliableDataInTransit =
                       peer->reliableDataInTransit -
                       (uint)*(ushort *)((long)&position_00[2].next + 4);
                }
                peer->packetsLost = peer->packetsLost + 1;
                *(uint *)&position_00[1].previous = uVar8 * 2;
                pvVar19 = enet_list_remove(position_00);
                enet_list_insert(position,pvVar19);
                p_Var10 = (peer->sentReliableCommands).sentinel.next;
                if (p_Var10 != &pEVar2->sentinel && p_Var24 == p_Var10) {
                  peer->nextTimeout =
                       *(int *)&p_Var24[1].previous + *(int *)((long)&p_Var24[1].next + 4);
                }
              }
            }
          }
        }
        pEVar2 = &peer->outgoingCommands;
        if ((((peer->outgoingCommands).sentinel.next == &pEVar2->sentinel) ||
            (iVar15 = enet_protocol_check_outgoing_commands(host,peer), iVar15 != 0)) &&
           ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel)) {
          uVar21 = host->serviceTime - peer->lastReceiveTime;
          uVar20 = peer->lastReceiveTime - host->serviceTime;
          if (uVar21 < 86400000) {
            uVar20 = uVar21;
          }
          if ((peer->pingInterval <= uVar20) && (3 < (ulong)peer->mtu - host->packetSize)) {
            enet_peer_ping(peer);
            enet_protocol_check_outgoing_commands(host,peer);
          }
        }
        if (host->commandCount != 0) {
          eVar16 = peer->packetLossEpoch;
          eVar7 = host->serviceTime;
          if (eVar16 == 0) {
            peer->packetLossEpoch = eVar7;
          }
          else {
            uVar20 = eVar16 - eVar7;
            if (eVar7 - eVar16 < 86400000) {
              uVar20 = eVar7 - eVar16;
            }
            if ((9999 < uVar20) && (peer->packetsSent != 0)) {
              uVar20 = peer->packetLoss;
              uVar21 = (peer->packetsLost << 0x10) / peer->packetsSent;
              iVar15 = uVar21 - uVar20;
              if (uVar21 < uVar20) {
                iVar15 = -(uVar21 - uVar20);
              }
              peer->packetLossVariance = peer->packetLossVariance * 3 + iVar15 >> 2;
              peer->packetLoss = uVar20 * 7 + uVar21 >> 3;
              peer->packetLossEpoch = eVar7;
              peer->packetsSent = 0;
              peer->packetsLost = 0;
            }
          }
          host->buffers[0].data = headerData;
          uVar14 = host->headerFlags;
          sVar18 = 2;
          if ((short)uVar14 < 0) {
            headerData._2_2_ = (ushort)eVar7 << 8 | (ushort)eVar7 >> 8;
            sVar18 = 4;
          }
          host->buffers[0].dataLength = sVar18;
          pvVar19 = (host->compressor).context;
          if ((pvVar19 == (void *)0x0) ||
             (p_Var11 = (host->compressor).compress,
             p_Var11 ==
             (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *)0x0)) {
LAB_001596a7:
            sVar18 = 0;
          }
          else {
            uVar25 = host->packetSize - 4;
            sVar18 = (*p_Var11)(pvVar19,host->buffers + 1,host->bufferCount - 1,uVar25,
                                host->packetData[1],uVar25);
            uVar14 = host->headerFlags;
            if (uVar25 <= sVar18 || sVar18 == 0) goto LAB_001596a7;
            uVar14 = uVar14 | 0x4000;
            host->headerFlags = uVar14;
          }
          uVar6 = peer->outgoingPeerID;
          if (uVar6 < 0xfff) {
            iVar15._0_1_ = peer->outgoingSessionID;
            iVar15._1_1_ = peer->incomingSessionID;
            iVar15._2_2_ = *(undefined2 *)&peer->field_0x22;
            uVar14 = uVar14 | (ushort)(iVar15 << 0xc);
            host->headerFlags = uVar14;
          }
          headerData._0_2_ = (uVar14 | uVar6) << 8 | (uVar14 | uVar6) >> 8;
          p_Var12 = host->checksum;
          if (p_Var12 != (ENetChecksumCallback)0x0) {
            eVar16 = 0;
            if (uVar6 < 0xfff) {
              eVar16 = peer->connectID;
            }
            sVar13 = host->buffers[0].dataLength;
            *(enet_uint32 *)(headerData + sVar13) = eVar16;
            host->buffers[0].dataLength = sVar13 + 4;
            eVar16 = (*p_Var12)(host->buffers,host->bufferCount);
            *(enet_uint32 *)(headerData + sVar13) = eVar16;
          }
          if (sVar18 == 0) {
            sVar18 = host->bufferCount;
          }
          else {
            host->buffers[1].data = host->packetData + 1;
            host->buffers[1].dataLength = sVar18;
            host->bufferCount = 2;
            sVar18 = 2;
          }
          peer->lastSendTime = host->serviceTime;
          iVar15 = enet_socket_send(host->socket,&peer->address,host->buffers,sVar18);
          pEVar3 = &peer->sentUnreliableCommands;
          p_Var24 = (peer->sentUnreliableCommands).sentinel.next;
          if (p_Var24 != &pEVar3->sentinel) {
            do {
              enet_list_remove(p_Var24);
              packet = (ENetPacket *)p_Var24[5].previous;
              if ((packet != (ENetPacket *)0x0) &&
                 (packet->referenceCount = packet->referenceCount - 1, packet->referenceCount == 0))
              {
                pbVar1 = (byte *)((long)&packet->flags + 1);
                *pbVar1 = *pbVar1 | 1;
                enet_packet_destroy(packet);
              }
              enet_free(p_Var24);
              p_Var24 = (pEVar3->sentinel).next;
            } while (p_Var24 != &pEVar3->sentinel);
            if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
                ((pEVar2->sentinel).next == &pEVar2->sentinel)) &&
               ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel
               )) {
              enet_peer_disconnect(peer,peer->eventData);
            }
          }
          if (iVar15 < 0) {
            return -1;
          }
          uVar4 = host->totalSentData;
          uVar5 = host->totalSentPackets;
          host->totalSentData = iVar15 + uVar4;
          host->totalSentPackets = uVar5 + 1;
        }
      }
LAB_00159800:
      pEVar17 = host->peers;
    }
    iVar15 = host->continueSending;
  } while( true );
}

Assistant:

static int
enet_protocol_send_outgoing_commands (ENetHost * host, ENetEvent * event, int checkForTimeouts)
{
    enet_uint8 headerData [sizeof (ENetProtocolHeader) + sizeof (enet_uint32)];
    ENetProtocolHeader * header = (ENetProtocolHeader *) headerData;
    ENetPeer * currentPeer;
    int sentLength;
    size_t shouldCompress = 0;
 
    host -> continueSending = 1;

    while (host -> continueSending)
    for (host -> continueSending = 0,
           currentPeer = host -> peers;
         currentPeer < & host -> peers [host -> peerCount];
         ++ currentPeer)
    {
        if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED ||
            currentPeer -> state == ENET_PEER_STATE_ZOMBIE)
          continue;

        host -> headerFlags = 0;
        host -> commandCount = 0;
        host -> bufferCount = 1;
        host -> packetSize = sizeof (ENetProtocolHeader);

        if (! enet_list_empty (& currentPeer -> acknowledgements))
          enet_protocol_send_acknowledgements (host, currentPeer);

        if (checkForTimeouts != 0 &&
            ! enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_GREATER_EQUAL (host -> serviceTime, currentPeer -> nextTimeout) &&
            enet_protocol_check_timeouts (host, currentPeer, event) == 1)
        {
            if (event != NULL && event -> type != ENET_EVENT_TYPE_NONE)
              return 1;
            else
              continue;
        }

        if ((enet_list_empty (& currentPeer -> outgoingCommands) ||
              enet_protocol_check_outgoing_commands (host, currentPeer)) &&
            enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> lastReceiveTime) >= currentPeer -> pingInterval &&
            currentPeer -> mtu - host -> packetSize >= sizeof (ENetProtocolPing))
        { 
            enet_peer_ping (currentPeer);
            enet_protocol_check_outgoing_commands (host, currentPeer);
        }

        if (host -> commandCount == 0)
          continue;

        if (currentPeer -> packetLossEpoch == 0)
          currentPeer -> packetLossEpoch = host -> serviceTime;
        else
        if (ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> packetLossEpoch) >= ENET_PEER_PACKET_LOSS_INTERVAL &&
            currentPeer -> packetsSent > 0)
        {
           enet_uint32 packetLoss = currentPeer -> packetsLost * ENET_PEER_PACKET_LOSS_SCALE / currentPeer -> packetsSent;

#ifdef ENET_DEBUG
           printf ("peer %u: %f%%+-%f%% packet loss, %u+-%u ms round trip time, %f%% throttle, %u outgoing, %u/%u incoming\n", currentPeer -> incomingPeerID, currentPeer -> packetLoss / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> packetLossVariance / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> roundTripTime, currentPeer -> roundTripTimeVariance, currentPeer -> packetThrottle / (float) ENET_PEER_PACKET_THROTTLE_SCALE, enet_list_size (& currentPeer -> outgoingCommands), currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingReliableCommands) : 0, currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingUnreliableCommands) : 0);
#endif

           currentPeer -> packetLossVariance = (currentPeer -> packetLossVariance * 3 + ENET_DIFFERENCE (packetLoss, currentPeer -> packetLoss)) / 4;
           currentPeer -> packetLoss = (currentPeer -> packetLoss * 7 + packetLoss) / 8;

           currentPeer -> packetLossEpoch = host -> serviceTime;
           currentPeer -> packetsSent = 0;
           currentPeer -> packetsLost = 0;
        }

        host -> buffers -> data = headerData;
        if (host -> headerFlags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME)
        {
            header -> sentTime = ENET_HOST_TO_NET_16 (host -> serviceTime & 0xFFFF);

            host -> buffers -> dataLength = sizeof (ENetProtocolHeader);
        }
        else
          host -> buffers -> dataLength = (size_t) & ((ENetProtocolHeader *) 0) -> sentTime;

        shouldCompress = 0;
        if (host -> compressor.context != NULL && host -> compressor.compress != NULL)
        {
            size_t originalSize = host -> packetSize - sizeof(ENetProtocolHeader),
                   compressedSize = host -> compressor.compress (host -> compressor.context,
                                        & host -> buffers [1], host -> bufferCount - 1,
                                        originalSize,
                                        host -> packetData [1],
                                        originalSize);
            if (compressedSize > 0 && compressedSize < originalSize)
            {
                host -> headerFlags |= ENET_PROTOCOL_HEADER_FLAG_COMPRESSED;
                shouldCompress = compressedSize;
#ifdef ENET_DEBUG_COMPRESS
                printf ("peer %u: compressed %u -> %u (%u%%)\n", currentPeer -> incomingPeerID, originalSize, compressedSize, (compressedSize * 100) / originalSize);
#endif
            }
        }

        if (currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID)
          host -> headerFlags |= currentPeer -> outgoingSessionID << ENET_PROTOCOL_HEADER_SESSION_SHIFT;
        header -> peerID = ENET_HOST_TO_NET_16 (currentPeer -> outgoingPeerID | host -> headerFlags);
        if (host -> checksum != NULL)
        {
            enet_uint32 * checksum = (enet_uint32 *) & headerData [host -> buffers -> dataLength];
            * checksum = currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID ? currentPeer -> connectID : 0;
            host -> buffers -> dataLength += sizeof (enet_uint32);
            * checksum = host -> checksum (host -> buffers, host -> bufferCount);
        }

        if (shouldCompress > 0)
        {
            host -> buffers [1].data = host -> packetData [1];
            host -> buffers [1].dataLength = shouldCompress;
            host -> bufferCount = 2;
        }

        currentPeer -> lastSendTime = host -> serviceTime;

        sentLength = enet_socket_send (host -> socket, & currentPeer -> address, host -> buffers, host -> bufferCount);

        enet_protocol_remove_sent_unreliable_commands (currentPeer);

        if (sentLength < 0)
          return -1;

        host -> totalSentData += sentLength;
        host -> totalSentPackets ++;
    }
   
    return 0;
}